

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
* anon_unknown.dwarf_ea566c::ParsePubkeyInner
            (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             *__return_storage_ptr__,uint32_t key_exp_index,Span<const_char> *sp,
            ParseScriptContext ctx,FlatSigningProvider *out,bool *apostrophe,string *error)

{
  long lVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  pointer puVar4;
  undefined8 *puVar5;
  pointer pvVar6;
  bool bVar7;
  BIP32PubkeyProvider *pBVar8;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *this;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *__result;
  pointer puVar9;
  pointer __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  _Tp_alloc_type *__alloc;
  char *__s;
  size_t __n;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *this_00;
  tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *ptVar12;
  uchar *puVar13;
  CExtPubKey *pCVar14;
  undefined4 *puVar15;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_01;
  secure_unique_ptr<KeyType> *this_02;
  pointer __p;
  pointer pvVar16;
  long in_FS_OFFSET;
  byte bVar17;
  string_view hex_str;
  string_view str_00;
  uint32_t local_214;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *local_210;
  _Head_base<0UL,_(anonymous_namespace)::BIP32PubkeyProvider_*,_false> local_1e8;
  undefined8 local_1e0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  paths;
  _Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_> local_1c0;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_1a8;
  uint32_t key_exp_index_local;
  uchar fullkey [33];
  uchar local_167 [91];
  CExtPubKey extpubkey;
  CExtKey extkey;
  string str;
  
  bVar17 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key_exp_index_local = key_exp_index;
  util::Split<Span<char_const>>
            ((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)&local_1c0,(util *)sp,
             (Span<const_char> *)0x2f,(char)ctx);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&str,(local_1c0._M_impl.super__Vector_impl_data._M_start)->m_data,
             (local_1c0._M_impl.super__Vector_impl_data._M_start)->m_data +
             (local_1c0._M_impl.super__Vector_impl_data._M_start)->m_size);
  if (str._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (error,"No key provided");
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_0030c0b4;
  }
  if ((long)local_1c0._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1c0._M_impl.super__Vector_impl_data._M_start == 0x10) {
    str_00._M_str = str._M_dataplus._M_p;
    str_00._M_len = str._M_string_length;
    bVar7 = IsHex(str_00);
    if (bVar7) {
      hex_str._M_str = str._M_dataplus._M_p;
      hex_str._M_len = str._M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&extkey,hex_str);
      CPubKey::Set<unsigned_char_const*>
                ((CPubKey *)&extpubkey,(uchar *)CONCAT71(extkey._1_7_,extkey.nDepth),
                 (uchar *)extkey._8_8_);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((ulong)extpubkey.version[0] & 0xfffffffffffffffe);
      if ((((char)pbVar10 != '\x02') &&
          ((7 < extpubkey.version[0] ||
           (pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd0,
           (0xd0U >> (extpubkey.version[0] & 0x1f) & 1) == 0)))) ||
         (bVar7 = CPubKey::IsValidNonHybrid((CPubKey *)&extpubkey), bVar7)) {
        bVar7 = CPubKey::IsFullyValid((CPubKey *)&extpubkey);
        if (!bVar7) {
          if ((ctx == P2TR) &&
             (puVar5 = (undefined8 *)CONCAT71(extkey._1_7_,extkey.nDepth),
             pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       extkey._8_8_, extkey._8_8_ - (long)puVar5 == 0x20)) {
            fullkey[1] = '\0';
            fullkey[2] = '\0';
            fullkey[3] = '\0';
            fullkey[4] = '\0';
            fullkey[5] = '\0';
            fullkey[6] = '\0';
            fullkey[7] = '\0';
            fullkey[8] = '\0';
            fullkey[9] = '\0';
            fullkey[10] = '\0';
            fullkey[0xb] = '\0';
            fullkey[0xc] = '\0';
            fullkey[0xd] = '\0';
            fullkey[0xe] = '\0';
            fullkey[0xf] = '\0';
            fullkey[0x10] = '\0';
            fullkey[0x11] = '\0';
            fullkey[0x12] = '\0';
            fullkey[0x13] = '\0';
            fullkey[0x14] = '\0';
            fullkey[0x15] = '\0';
            fullkey[0x16] = '\0';
            fullkey[0x17] = '\0';
            fullkey[0x18] = '\0';
            fullkey[0x19] = '\0';
            fullkey[0x1a] = '\0';
            fullkey[0x1b] = '\0';
            fullkey[0x1c] = '\0';
            fullkey[0x1d] = '\0';
            fullkey[0x1e] = '\0';
            fullkey[0x1f] = '\0';
            fullkey[0x20] = '\0';
            fullkey[0] = '\x02';
            if ((undefined8 *)extkey._8_8_ != puVar5) {
              fullkey._17_7_ = (undefined7)puVar5[2];
              fullkey[0x18] = (uchar)((ulong)puVar5[2] >> 0x38);
              fullkey._25_7_ = (undefined7)puVar5[3];
              fullkey[0x20] = (uchar)((ulong)puVar5[3] >> 0x38);
              fullkey._1_7_ = (undefined7)*puVar5;
              fullkey[8] = (uchar)((ulong)*puVar5 >> 0x38);
              fullkey._9_7_ = (undefined7)puVar5[1];
              fullkey[0x10] = (uchar)((ulong)puVar5[1] >> 0x38);
            }
            CPubKey::Set<unsigned_char*>((CPubKey *)&extpubkey,fullkey,local_167);
            bVar7 = CPubKey::IsFullyValid((CPubKey *)&extpubkey);
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      extkey._8_8_;
            if (bVar7) {
              local_1e8._M_head_impl._0_1_ = 1;
              std::
              make_unique<(anonymous_namespace)::ConstPubkeyProvider,unsigned_int&,CPubKey&,bool>
                        ((uint *)&paths,(CPubKey *)&key_exp_index_local,(bool *)&extpubkey);
              std::
              vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
              ::
              emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                        ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                          *)&local_1a8,
                         (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                          *)&paths);
              this_01 = &paths;
              goto LAB_0030bf9d;
            }
          }
          tinyformat::format<std::__cxx11::string>
                    ((string *)fullkey,(tinyformat *)"Pubkey \'%s\' is invalid",(char *)&str,pbVar10
                    );
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           fullkey);
          std::__cxx11::string::~string((string *)fullkey);
          goto LAB_0030c097;
        }
        if ((P2SH < ctx) && ((extpubkey.version[0] & 0xfe) != 2)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (error,"Uncompressed keys are not allowed");
          goto LAB_0030c097;
        }
        paths.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)paths.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        std::make_unique<(anonymous_namespace)::ConstPubkeyProvider,unsigned_int&,CPubKey&,bool>
                  ((uint *)fullkey,(CPubKey *)&key_exp_index_local,(bool *)&extpubkey);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
        ::
        emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                  ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                    *)&local_1a8,
                   (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                    *)fullkey);
        this_01 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)fullkey;
LAB_0030bf9d:
        std::
        unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                       *)this_01);
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start =
             local_1a8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish =
             local_1a8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1a8.
             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1a8.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (error,"Hybrid public keys are not allowed");
LAB_0030c097:
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&extkey);
      goto LAB_0030c0b4;
    }
    DecodeSecret((string *)&extkey);
    this_02 = (secure_unique_ptr<KeyType> *)&extkey.nChild;
    if (extkey._8_8_ == 0) {
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::~unique_ptr(this_02);
      goto LAB_0030bb3b;
    }
    if ((ctx < P2WPKH) || (extkey.nDepth == '\x01')) {
      CKey::GetPubKey((CPubKey *)&extpubkey,(CKey *)&extkey);
      CPubKey::GetID((CKeyID *)fullkey,(CPubKey *)&extpubkey);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
      ::_M_emplace_unique<CKeyID,CKey&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                  *)&out->keys,(CKeyID *)fullkey,(CKey *)&extkey);
      paths.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(paths.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,ctx == P2TR);
      std::make_unique<(anonymous_namespace)::ConstPubkeyProvider,unsigned_int&,CPubKey&,bool>
                ((uint *)fullkey,(CPubKey *)&key_exp_index_local,(bool *)&extpubkey);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
      ::
      emplace_back<std::unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>>>
                ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
                  *)&local_1a8,
                 (unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                  *)fullkey);
      std::
      unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::ConstPubkeyProvider,_std::default_delete<(anonymous_namespace)::ConstPubkeyProvider>_>
                     *)fullkey);
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1a8.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (error,"Uncompressed keys are not allowed");
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
  }
  else {
LAB_0030bb3b:
    DecodeExtKey(&extkey,&str);
    DecodeExtPubKey(&extpubkey,&str);
    if ((((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )extkey.key.keydata._M_t.
            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )0x0) &&
        (pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)extpubkey.pubkey.vch[0] & 0xfffffffffffffffe), (char)pbVar10 != '\x02'))
       && ((7 < extpubkey.pubkey.vch[0] ||
           (pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd0,
           (0xd0U >> (extpubkey.pubkey.vch[0] & 0x1f) & 1) == 0)))) {
      tinyformat::format<std::__cxx11::string>
                ((string *)fullkey,(tinyformat *)"key \'%s\' is not valid",(char *)&str,pbVar10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fullkey)
      ;
      std::__cxx11::string::~string((string *)fullkey);
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      paths.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paths.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      paths.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fullkey[0] = 0xb8;
      fullkey[1] = 0xdd;
      fullkey[2] = '@';
      fullkey[3] = '\0';
      fullkey[4] = '\0';
      fullkey[5] = '\0';
      fullkey[6] = '\0';
      fullkey[7] = '\0';
      fullkey[8] = '\x01';
      fullkey[9] = '\0';
      fullkey[10] = '\0';
      fullkey[0xb] = '\0';
      fullkey[0xc] = '\0';
      fullkey[0xd] = '\0';
      fullkey[0xe] = '\0';
      fullkey[0xf] = '\0';
      bVar7 = std::ranges::__equal_fn::
              operator()<Span<const_char>_&,_Span<const_char>,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,
                         local_1c0._M_impl.super__Vector_impl_data._M_finish + -1);
      if (bVar7) {
        local_214 = 1;
LAB_0030bc86:
        local_1c0._M_impl.super__Vector_impl_data._M_finish =
             local_1c0._M_impl.super__Vector_impl_data._M_finish + -1;
      }
      else {
        builtin_memcpy(fullkey,"\x1d+B",4);
        fullkey[4] = '\0';
        fullkey[5] = '\0';
        fullkey[6] = '\0';
        fullkey[7] = '\0';
        fullkey[8] = '\x02';
        fullkey[9] = '\0';
        fullkey[10] = '\0';
        fullkey[0xb] = '\0';
        fullkey[0xc] = '\0';
        fullkey[0xd] = '\0';
        fullkey[0xe] = '\0';
        fullkey[0xf] = '\0';
        bVar7 = std::ranges::__equal_fn::
                operator()<Span<const_char>_&,_Span<const_char>,_std::ranges::equal_to,_std::identity,_std::identity>
                          ((__equal_fn *)&std::ranges::equal);
        if (bVar7) {
LAB_0030bc4c:
          builtin_memcpy(fullkey,"\x1d+B",4);
          fullkey[4] = '\0';
          fullkey[5] = '\0';
          fullkey[6] = '\0';
          fullkey[7] = '\0';
          fullkey[8] = '\x02';
          fullkey[9] = '\0';
          fullkey[10] = '\0';
          fullkey[0xb] = '\0';
          fullkey[0xc] = '\0';
          fullkey[0xd] = '\0';
          fullkey[0xe] = '\0';
          fullkey[0xf] = '\0';
          bVar7 = std::ranges::__equal_fn::
                  operator()<Span<const_char>_&,_Span<const_char>,_std::ranges::equal_to,_std::identity,_std::identity>
                            ((__equal_fn *)&std::ranges::equal,
                             local_1c0._M_impl.super__Vector_impl_data._M_finish + -1);
          *apostrophe = bVar7;
          local_214 = 2;
          goto LAB_0030bc86;
        }
        local_1e8._M_head_impl = (BIP32PubkeyProvider *)0x422b20;
        local_1e0 = 2;
        bVar7 = std::ranges::__equal_fn::
                operator()<Span<const_char>_&,_Span<const_char>,_std::ranges::equal_to,_std::identity,_std::identity>
                          ((__equal_fn *)&std::ranges::equal,
                           local_1c0._M_impl.super__Vector_impl_data._M_finish + -1);
        local_214 = 0;
        if (bVar7) goto LAB_0030bc4c;
      }
      bVar7 = ParseKeyPath((vector<Span<const_char>,_std::allocator<Span<const_char>_>_> *)
                           &local_1c0,&paths,apostrophe,error,true);
      this_00 = __return_storage_ptr__;
      if (bVar7) {
        if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )extkey.key.keydata._M_t.
              super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             )0x0) {
          CExtKey::Neuter((CExtPubKey *)fullkey,&extkey);
          puVar13 = fullkey;
          pCVar14 = &extpubkey;
          for (lVar11 = 0x71; lVar11 != 0; lVar11 = lVar11 + -1) {
            pCVar14->version[0] = *puVar13;
            puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
            pCVar14 = (CExtPubKey *)((long)pCVar14 + (ulong)bVar17 * -2 + 1);
          }
          CPubKey::GetID((CKeyID *)fullkey,&extpubkey.pubkey);
          std::
          _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
          ::_M_emplace_unique<CKeyID,CKey&>
                    ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                      *)&out->keys,(CKeyID *)fullkey,&extkey.key);
        }
        pvVar6 = paths.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ptVar12 = (tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                   *)0x0;
        __last = (pointer)0x0;
        local_210 = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     *)0x0;
        for (pvVar16 = paths.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 = &local_1a8,
            pvVar16 != pvVar6; pvVar16 = pvVar16 + 1) {
          pBVar8 = (BIP32PubkeyProvider *)operator_new(0xa0);
          pp_Var2 = (_func_int **)
                    (pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          pp_Var3 = (_func_int **)
                    (pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar4 = (pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          (pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar16->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar7 = *apostrophe;
          *(uint32_t *)((long)&pBVar8->super_PubkeyProvider + 8) = key_exp_index;
          (pBVar8->super_PubkeyProvider)._vptr_PubkeyProvider =
               (_func_int **)&PTR__BIP32PubkeyProvider_0063cd88;
          pCVar14 = &extpubkey;
          puVar15 = (undefined4 *)((long)&pBVar8->super_PubkeyProvider + 0xc);
          for (__alloc = (_Tp_alloc_type *)0x1d; __alloc != (_Tp_alloc_type *)0x0;
              __alloc = __alloc + -1) {
            *puVar15 = *(undefined4 *)pCVar14->version;
            pCVar14 = (CExtPubKey *)((long)pCVar14 + (ulong)bVar17 * -8 + 4);
            puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
          }
          ((PubkeyProvider *)&pBVar8->m_path)->_vptr_PubkeyProvider = pp_Var3;
          *(pointer *)&((PubkeyProvider *)&pBVar8->m_path)->m_expr_index = puVar4;
          ((PubkeyProvider *)((long)&pBVar8->m_path + 0x10))->_vptr_PubkeyProvider = pp_Var2;
          fullkey[0x10] = '\0';
          fullkey[0x11] = '\0';
          fullkey[0x12] = '\0';
          fullkey[0x13] = '\0';
          fullkey[0x14] = '\0';
          fullkey[0x15] = '\0';
          fullkey[0x16] = '\0';
          fullkey[0x17] = '\0';
          fullkey[0] = '\0';
          fullkey[1] = '\0';
          fullkey[2] = '\0';
          fullkey[3] = '\0';
          fullkey[4] = '\0';
          fullkey[5] = '\0';
          fullkey[6] = '\0';
          fullkey[7] = '\0';
          fullkey[8] = '\0';
          fullkey[9] = '\0';
          fullkey[10] = '\0';
          fullkey[0xb] = '\0';
          fullkey[0xc] = '\0';
          fullkey[0xd] = '\0';
          fullkey[0xe] = '\0';
          fullkey[0xf] = '\0';
          pBVar8->m_derive = local_214;
          pBVar8->m_apostrophe = bVar7;
          local_1e8._M_head_impl = pBVar8;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)fullkey);
          if (__last == (pointer)ptVar12) {
            this = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    *)std::
                      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      ::_M_check_len(this_00,(size_type)pCVar14,__s);
            __result = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        *)std::
                          _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                          ::_M_allocate(this,(size_t)pCVar14);
            local_1e8._M_head_impl = (BIP32PubkeyProvider *)0x0;
            *(BIP32PubkeyProvider **)((long)__result + ((long)ptVar12 - (long)local_210)) = pBVar8;
            puVar9 = std::
                     vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     ::_S_relocate((pointer)local_210,__last,(pointer)__result,__alloc);
            __last = std::
                     vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                     ::_S_relocate(__last,__last,puVar9 + 1,__alloc);
            std::
            _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ::_M_deallocate(local_210,(pointer)((long)ptVar12 - (long)local_210 >> 3),__n);
            ptVar12 = (tuple<(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                       *)&(__result->_M_impl).super__Vector_impl_data._M_start + (long)this;
            local_210 = __result;
            local_1a8.
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)__result;
            local_1a8.
            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ptVar12;
          }
          else {
            local_1e8._M_head_impl = (BIP32PubkeyProvider *)0x0;
            (__last->_M_t).
            super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
            ._M_t.
            super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
            .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl =
                 (PubkeyProvider *)pBVar8;
            __last = __last + 1;
          }
          local_1a8.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __last;
          std::
          unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
                         *)&local_1e8);
        }
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)local_210;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __last;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ptVar12;
      }
      (this_00->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->
      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&paths);
    }
    this_02 = &extkey.key.keydata;
  }
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(this_02);
LAB_0030c0b4:
  std::__cxx11::string::~string((string *)&str);
  std::_Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>::~_Vector_base(&local_1c0)
  ;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<PubkeyProvider>> ParsePubkeyInner(uint32_t key_exp_index, const Span<const char>& sp, ParseScriptContext ctx, FlatSigningProvider& out, bool& apostrophe, std::string& error)
{
    std::vector<std::unique_ptr<PubkeyProvider>> ret;
    bool permit_uncompressed = ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH;
    auto split = Split(sp, '/');
    std::string str(split[0].begin(), split[0].end());
    if (str.size() == 0) {
        error = "No key provided";
        return {};
    }
    if (split.size() == 1) {
        if (IsHex(str)) {
            std::vector<unsigned char> data = ParseHex(str);
            CPubKey pubkey(data);
            if (pubkey.IsValid() && !pubkey.IsValidNonHybrid()) {
                error = "Hybrid public keys are not allowed";
                return {};
            }
            if (pubkey.IsFullyValid()) {
                if (permit_uncompressed || pubkey.IsCompressed()) {
                    ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, false));
                    return ret;
                } else {
                    error = "Uncompressed keys are not allowed";
                    return {};
                }
            } else if (data.size() == 32 && ctx == ParseScriptContext::P2TR) {
                unsigned char fullkey[33] = {0x02};
                std::copy(data.begin(), data.end(), fullkey + 1);
                pubkey.Set(std::begin(fullkey), std::end(fullkey));
                if (pubkey.IsFullyValid()) {
                    ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, true));
                    return ret;
                }
            }
            error = strprintf("Pubkey '%s' is invalid", str);
            return {};
        }
        CKey key = DecodeSecret(str);
        if (key.IsValid()) {
            if (permit_uncompressed || key.IsCompressed()) {
                CPubKey pubkey = key.GetPubKey();
                out.keys.emplace(pubkey.GetID(), key);
                ret.emplace_back(std::make_unique<ConstPubkeyProvider>(key_exp_index, pubkey, ctx == ParseScriptContext::P2TR));
                return ret;
            } else {
                error = "Uncompressed keys are not allowed";
                return {};
            }
        }
    }
    CExtKey extkey = DecodeExtKey(str);
    CExtPubKey extpubkey = DecodeExtPubKey(str);
    if (!extkey.key.IsValid() && !extpubkey.pubkey.IsValid()) {
        error = strprintf("key '%s' is not valid", str);
        return {};
    }
    std::vector<KeyPath> paths;
    DeriveType type = DeriveType::NO;
    if (std::ranges::equal(split.back(), Span{"*"}.first(1))) {
        split.pop_back();
        type = DeriveType::UNHARDENED;
    } else if (std::ranges::equal(split.back(), Span{"*'"}.first(2)) || std::ranges::equal(split.back(), Span{"*h"}.first(2))) {
        apostrophe = std::ranges::equal(split.back(), Span{"*'"}.first(2));
        split.pop_back();
        type = DeriveType::HARDENED;
    }
    if (!ParseKeyPath(split, paths, apostrophe, error, /*allow_multipath=*/true)) return {};
    if (extkey.key.IsValid()) {
        extpubkey = extkey.Neuter();
        out.keys.emplace(extpubkey.pubkey.GetID(), extkey.key);
    }
    for (auto& path : paths) {
        ret.emplace_back(std::make_unique<BIP32PubkeyProvider>(key_exp_index, extpubkey, std::move(path), type, apostrophe));
    }
    return ret;
}